

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.c
# Opt level: O0

int glfwJoystickIsGamepad(int jid)

{
  int iVar1;
  _GLFWjoystick *js;
  int jid_local;
  
  if (jid < 0) {
    __assert_fail("jid >= GLFW_JOYSTICK_1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/GordaNN[P]voxel_game/project/third-party/glfw-3.3.1/src/input.c"
                  ,0x49b,"int glfwJoystickIsGamepad(int)");
  }
  if (jid < 0x10) {
    if (_glfw.initialized == 0) {
      _glfwInputError(0x10001,(char *)0x0);
      js._4_4_ = 0;
    }
    else if ((jid < 0) || (0xf < jid)) {
      _glfwInputError(0x10003,"Invalid joystick ID %i",(ulong)(uint)jid);
      js._4_4_ = 0;
    }
    else if (_glfw.joysticks[jid].present == 0) {
      js._4_4_ = 0;
    }
    else {
      iVar1 = _glfwPlatformPollJoystick(_glfw.joysticks + jid,0);
      if (iVar1 == 0) {
        js._4_4_ = 0;
      }
      else {
        js._4_4_ = (uint)(_glfw.joysticks[jid].mapping != (_GLFWmapping *)0x0);
      }
    }
    return js._4_4_;
  }
  __assert_fail("jid <= GLFW_JOYSTICK_LAST",
                "/workspace/llm4binary/github/license_all_cmakelists_25/GordaNN[P]voxel_game/project/third-party/glfw-3.3.1/src/input.c"
                ,0x49c,"int glfwJoystickIsGamepad(int)");
}

Assistant:

GLFWAPI int glfwJoystickIsGamepad(int jid)
{
    _GLFWjoystick* js;

    assert(jid >= GLFW_JOYSTICK_1);
    assert(jid <= GLFW_JOYSTICK_LAST);

    _GLFW_REQUIRE_INIT_OR_RETURN(GLFW_FALSE);

    if (jid < 0 || jid > GLFW_JOYSTICK_LAST)
    {
        _glfwInputError(GLFW_INVALID_ENUM, "Invalid joystick ID %i", jid);
        return GLFW_FALSE;
    }

    js = _glfw.joysticks + jid;
    if (!js->present)
        return GLFW_FALSE;

    if (!_glfwPlatformPollJoystick(js, _GLFW_POLL_PRESENCE))
        return GLFW_FALSE;

    return js->mapping != NULL;
}